

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O0

reference __thiscall
absl::InlinedVector<S2ShapeIndexCell_const*,6ul,std::allocator<S2ShapeIndexCell_const*>>::
GrowAndEmplaceBack<S2ShapeIndexCell_const*>
          (InlinedVector<S2ShapeIndexCell_const*,6ul,std::allocator<S2ShapeIndexCell_const*>> *this,
          S2ShapeIndexCell **args)

{
  Allocation new_allocation_00;
  size_type sVar1;
  size_type sVar2;
  allocator_type *a;
  pointer ppSVar3;
  reference ppSVar4;
  move_iterator<const_S2ShapeIndexCell_**> src;
  move_iterator<const_S2ShapeIndexCell_**> src_last;
  reference new_element;
  Allocation new_allocation;
  size_type s;
  S2ShapeIndexCell **args_local;
  InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>
  *this_local;
  
  sVar1 = InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>::
          size((InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>
                *)this);
  sVar2 = InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>::
          capacity((InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>
                    *)this);
  if (sVar1 == sVar2) {
    new_allocation.buffer_ =
         (pointer)InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>
                  ::size((InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>
                          *)this);
    a = InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>::
        allocator((InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>
                   *)this);
    sVar1 = InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>
            ::capacity((InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>
                        *)this);
    InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>::
    Allocation::Allocation((Allocation *)&new_element,a,sVar1 << 1);
    ppSVar3 = InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>
              ::Allocation::buffer((Allocation *)&new_element);
    ppSVar4 = Construct<S2ShapeIndexCell_const*>(this,ppSVar3 + (long)new_allocation.buffer_,args);
    ppSVar3 = InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>
              ::data((InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>
                      *)this);
    src = std::make_move_iterator<S2ShapeIndexCell_const**>(ppSVar3);
    ppSVar3 = InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>
              ::data((InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>
                      *)this);
    src_last = std::make_move_iterator<S2ShapeIndexCell_const**>
                         (ppSVar3 + (long)new_allocation.buffer_);
    ppSVar3 = InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>
              ::Allocation::buffer((Allocation *)&new_element);
    UninitializedCopy<std::move_iterator<S2ShapeIndexCell_const**>>(this,src,src_last,ppSVar3);
    new_allocation_00.buffer_ = (pointer)new_allocation.capacity_;
    new_allocation_00.capacity_ = (size_type)new_element;
    InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>::
    ResetAllocation((InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>
                     *)this,new_allocation_00,(long)new_allocation.buffer_ + 1);
    return ppSVar4;
  }
  __assert_fail("size() == capacity()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                ,0x327,
                "reference absl::InlinedVector<const S2ShapeIndexCell *, 6>::GrowAndEmplaceBack(Args &&...) [T = const S2ShapeIndexCell *, N = 6, A = std::allocator<const S2ShapeIndexCell *>, Args = <const S2ShapeIndexCell *>]"
               );
}

Assistant:

reference GrowAndEmplaceBack(Args&&... args) {
    assert(size() == capacity());
    const size_type s = size();

    Allocation new_allocation(allocator(), 2 * capacity());

    reference new_element =
        Construct(new_allocation.buffer() + s, std::forward<Args>(args)...);
    UninitializedCopy(std::make_move_iterator(data()),
                      std::make_move_iterator(data() + s),
                      new_allocation.buffer());

    ResetAllocation(new_allocation, s + 1);

    return new_element;
  }